

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PSVIWriterHandlers.cpp
# Opt level: O2

void __thiscall
PSVIWriterHandlers::processDOMAttributes(PSVIWriterHandlers *this,DOMNamedNodeMap *attrs)

{
  bool bVar1;
  bool bVar2;
  char cVar3;
  ulong uVar4;
  long *plVar5;
  XMLCh *pXVar6;
  unsigned_long *puVar7;
  ulong uVar8;
  XMLSize_t NScount;
  ulong local_38;
  
  this->fNSAttributes->fCurCount = 0;
  bVar1 = true;
  uVar8 = 0;
  while( true ) {
    local_38 = uVar8;
    uVar4 = (**(code **)(*(long *)attrs + 0x28))(attrs);
    if (uVar4 <= uVar8) break;
    plVar5 = (long *)(**(code **)(*(long *)attrs + 0x18))(attrs,local_38);
    pXVar6 = (XMLCh *)(**(code **)(*plVar5 + 0xb0))(plVar5);
    bVar2 = xercesc_4_0::XMLString::equals(pXVar6,(XMLCh *)&xercesc_4_0::XMLUni::fgXMLNSURIName);
    if (bVar2) {
      xercesc_4_0::ValueVectorOf<unsigned_long>::addElement(this->fNSAttributes,&local_38);
    }
    else {
      if (bVar1) {
        sendIndentedElement(this,(XMLCh *)&xercesc_4_0::PSVIUni::fgAttributes);
        bVar1 = false;
      }
      sendIndentedElement(this,(XMLCh *)&xercesc_4_0::PSVIUni::fgAttribute);
      pXVar6 = (XMLCh *)(**(code **)(*plVar5 + 0xb0))(plVar5);
      sendElementValue(this,(XMLCh *)&xercesc_4_0::PSVIUni::fgNamespaceName,pXVar6);
      pXVar6 = (XMLCh *)(**(code **)(*plVar5 + 0xc0))(plVar5);
      sendElementValue(this,(XMLCh *)&xercesc_4_0::PSVIUni::fgLocalName,pXVar6);
      pXVar6 = (XMLCh *)(**(code **)(*plVar5 + 0xb8))(plVar5);
      sendElementValue(this,(XMLCh *)&xercesc_4_0::PSVIUni::fgPrefix,pXVar6);
      pXVar6 = (XMLCh *)(**(code **)(*plVar5 + 0x150))(plVar5);
      sendElementValue(this,(XMLCh *)&xercesc_4_0::PSVIUni::fgNormalizedValue,pXVar6);
      cVar3 = (**(code **)(*plVar5 + 0x148))(plVar5);
      pXVar6 = (XMLCh *)&xercesc_4_0::PSVIUni::fgFalse;
      if (cVar3 != '\0') {
        pXVar6 = (XMLCh *)&xercesc_4_0::PSVIUni::fgTrue;
      }
      sendElementValue(this,(XMLCh *)&xercesc_4_0::PSVIUni::fgSpecified,pXVar6);
      plVar5 = (long *)(**(code **)(*plVar5 + 0x170))(plVar5);
      pXVar6 = (XMLCh *)(**(code **)(*plVar5 + 0x10))(plVar5);
      sendElementValue(this,(XMLCh *)&xercesc_4_0::PSVIUni::fgAttributeType,pXVar6);
      sendElementEmpty(this,(XMLCh *)&xercesc_4_0::PSVIUni::fgReferences);
      sendUnindentedElement(this,(XMLCh *)&xercesc_4_0::PSVIUni::fgAttribute);
    }
    uVar8 = local_38 + 1;
  }
  if (bVar1) {
    writeEmpty(this,(XMLCh *)&xercesc_4_0::PSVIUni::fgAttributes);
  }
  else {
    sendUnindentedElement(this,(XMLCh *)&xercesc_4_0::PSVIUni::fgAttributes);
  }
  if (this->fNSAttributes->fCurCount == 0) {
    writeEmpty(this,(XMLCh *)&xercesc_4_0::PSVIUni::fgNamespaceAttributes);
  }
  else {
    sendIndentedElement(this,(XMLCh *)&xercesc_4_0::PSVIUni::fgNamespaceAttributes);
    for (uVar8 = 0; uVar8 < this->fNSAttributes->fCurCount; uVar8 = uVar8 + 1) {
      puVar7 = xercesc_4_0::ValueVectorOf<unsigned_long>::elementAt(this->fNSAttributes,uVar8);
      plVar5 = (long *)(**(code **)(*(long *)attrs + 0x18))(attrs,*puVar7);
      sendIndentedElement(this,(XMLCh *)&xercesc_4_0::PSVIUni::fgAttribute);
      sendElementValue(this,(XMLCh *)&xercesc_4_0::PSVIUni::fgNamespaceName,
                       (XMLCh *)&xercesc_4_0::XMLUni::fgXMLNSURIName);
      pXVar6 = (XMLCh *)(**(code **)(*plVar5 + 0xc0))(plVar5);
      sendElementValue(this,(XMLCh *)&xercesc_4_0::PSVIUni::fgLocalName,pXVar6);
      pXVar6 = (XMLCh *)(**(code **)(*plVar5 + 0xb8))(plVar5);
      sendElementValue(this,(XMLCh *)&xercesc_4_0::PSVIUni::fgPrefix,pXVar6);
      pXVar6 = (XMLCh *)(**(code **)(*plVar5 + 0x150))(plVar5);
      sendElementValue(this,(XMLCh *)&xercesc_4_0::PSVIUni::fgNormalizedValue,pXVar6);
      cVar3 = (**(code **)(*plVar5 + 0x148))(plVar5);
      pXVar6 = (XMLCh *)&xercesc_4_0::PSVIUni::fgFalse;
      if (cVar3 != '\0') {
        pXVar6 = (XMLCh *)&xercesc_4_0::PSVIUni::fgTrue;
      }
      sendElementValue(this,(XMLCh *)&xercesc_4_0::PSVIUni::fgSpecified,pXVar6);
      plVar5 = (long *)(**(code **)(*plVar5 + 0x170))(plVar5);
      pXVar6 = (XMLCh *)(**(code **)(*plVar5 + 0x10))(plVar5);
      sendElementValue(this,(XMLCh *)&xercesc_4_0::PSVIUni::fgAttributeType,pXVar6);
      sendElementEmpty(this,(XMLCh *)&xercesc_4_0::PSVIUni::fgReferences);
      sendUnindentedElement(this,(XMLCh *)&xercesc_4_0::PSVIUni::fgAttribute);
    }
    sendUnindentedElement(this,(XMLCh *)&xercesc_4_0::PSVIUni::fgNamespaceAttributes);
  }
  return;
}

Assistant:

void PSVIWriterHandlers::processDOMAttributes(DOMNamedNodeMap* attrs) {
	fNSAttributes->removeAllElements();
	bool firstFlag = true;
	for (XMLSize_t count=0; count < attrs->getLength(); count++) {
		DOMAttr* attr = (DOMAttr*)attrs->item(count);
        if (XMLString::equals(attr->getNamespaceURI(), XMLUni::fgXMLNSURIName)) {
			fNSAttributes->addElement(count);
		} else {
			if (firstFlag) {
				sendIndentedElement(PSVIUni::fgAttributes);
				firstFlag = false;
			}
			sendIndentedElement(PSVIUni::fgAttribute);
			sendElementValue(PSVIUni::fgNamespaceName, attr->getNamespaceURI());
			sendElementValue(PSVIUni::fgLocalName, attr->getLocalName());
			sendElementValue(PSVIUni::fgPrefix, attr->getPrefix());
			sendElementValue(PSVIUni::fgNormalizedValue, attr->getValue());
			sendElementValue(PSVIUni::fgSpecified, translateBool(attr->getSpecified()));
			sendElementValue(PSVIUni::fgAttributeType, attr->getSchemaTypeInfo()->getTypeName());
			sendElementEmpty(PSVIUni::fgReferences);
			sendUnindentedElement(PSVIUni::fgAttribute);
		}
	}
	if (firstFlag)
		writeEmpty(PSVIUni::fgAttributes);
	else
		sendUnindentedElement(PSVIUni::fgAttributes);

	//now for namespace attributes
	if (fNSAttributes->size()==0) {
		writeEmpty(PSVIUni::fgNamespaceAttributes);
	} else {
		sendIndentedElement(PSVIUni::fgNamespaceAttributes);
		for (XMLSize_t NScount = 0; NScount < fNSAttributes->size(); NScount++) {
			DOMAttr* attr = (DOMAttr*)attrs->item(fNSAttributes->elementAt(NScount));
			sendIndentedElement(PSVIUni::fgAttribute);
			sendElementValue(PSVIUni::fgNamespaceName, XMLUni::fgXMLNSURIName);
			sendElementValue(PSVIUni::fgLocalName, attr->getLocalName());
			sendElementValue(PSVIUni::fgPrefix, attr->getPrefix());
			sendElementValue(PSVIUni::fgNormalizedValue, attr->getValue());
			sendElementValue(PSVIUni::fgSpecified, translateBool(attr->getSpecified()));
			sendElementValue(PSVIUni::fgAttributeType, attr->getSchemaTypeInfo()->getTypeName());
			sendElementEmpty(PSVIUni::fgReferences);
			sendUnindentedElement(PSVIUni::fgAttribute);
		}
		sendUnindentedElement(PSVIUni::fgNamespaceAttributes);
	}
}